

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O3

string * pystring::translate(string *__return_storage_ptr__,string *str,string *table,
                            string *deletechars)

{
  undefined4 uVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined6 uVar6;
  undefined1 auVar7 [12];
  size_type sVar8;
  size_type sVar9;
  long lVar10;
  short sVar11;
  undefined1 auVar12 [16];
  int trans_table [256];
  char *local_458;
  size_type local_450;
  char local_448;
  undefined7 uStack_447;
  undefined8 uStack_440;
  int aiStack_438 [258];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 uVar15;
  undefined2 uVar16;
  
  local_450 = 0;
  local_448 = '\0';
  sVar2 = str->_M_string_length;
  local_458 = &local_448;
  if (table->_M_string_length != 0x100) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
    if (local_458 == &local_448) {
      return __return_storage_ptr__;
    }
    operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
    return __return_storage_ptr__;
  }
  sVar9 = deletechars->_M_string_length;
  if (sVar9 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_458);
    if (sVar2 != 0) {
      sVar9 = 0;
      do {
        local_458[sVar9] = (table->_M_dataplus)._M_p[local_458[sVar9]];
        sVar9 = sVar9 + 1;
      } while (sVar2 != sVar9);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_00107d14:
    if (local_458 != &local_448) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_458;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
      goto LAB_00107d38;
    }
  }
  else {
    pcVar3 = (table->_M_dataplus)._M_p;
    lVar10 = 0;
    do {
      uVar1 = *(undefined4 *)(pcVar3 + lVar10);
      uVar15 = (undefined1)((uint)uVar1 >> 0x18);
      uVar16 = CONCAT11(uVar15,uVar15);
      uVar15 = (undefined1)((uint)uVar1 >> 0x10);
      uVar4 = CONCAT35(CONCAT21(uVar16,uVar15),CONCAT14(uVar15,uVar1));
      uVar15 = (undefined1)((uint)uVar1 >> 8);
      uVar6 = CONCAT51(CONCAT41((int)((ulong)uVar4 >> 0x20),uVar15),uVar15);
      sVar11 = CONCAT11((char)uVar1,(char)uVar1);
      uVar5 = CONCAT62(uVar6,sVar11);
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar5;
      auVar14._12_2_ = uVar16;
      auVar14._14_2_ = uVar16;
      uVar16 = (undefined2)((ulong)uVar4 >> 0x20);
      auVar13._12_4_ = auVar14._12_4_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = uVar5;
      auVar13._10_2_ = uVar16;
      auVar12._10_6_ = auVar13._10_6_;
      auVar12._8_2_ = uVar16;
      auVar12._0_8_ = uVar5;
      uVar16 = (undefined2)uVar6;
      auVar7._4_8_ = auVar12._8_8_;
      auVar7._2_2_ = uVar16;
      auVar7._0_2_ = uVar16;
      aiStack_438[lVar10] = (int)sVar11 >> 8;
      aiStack_438[lVar10 + 1] = auVar7._0_4_ >> 0x18;
      aiStack_438[lVar10 + 2] = auVar12._8_4_ >> 0x18;
      aiStack_438[lVar10 + 3] = auVar13._12_4_ >> 0x18;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x100);
    pcVar3 = (deletechars->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      aiStack_438[pcVar3[sVar8]] = -1;
      sVar8 = sVar8 + 1;
    } while (sVar9 != sVar8);
    if (sVar2 != 0) {
      sVar9 = 0;
      do {
        if (aiStack_438[(str->_M_dataplus)._M_p[sVar9]] != -1) {
          std::__cxx11::string::push_back((char)&local_458);
        }
        sVar9 = sVar9 + 1;
      } while (sVar2 != sVar9);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      goto LAB_00107d14;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_440;
LAB_00107d38:
  __return_storage_ptr__->_M_string_length = local_450;
  return __return_storage_ptr__;
}

Assistant:

std::string translate( const std::string & str, const std::string & table, const std::string & deletechars )
    {
        std::string s;
        std::string::size_type len = str.size(), dellen = deletechars.size();

        if ( table.size() != 256 )
        {
            // TODO : raise exception instead
            return str;
        }

        //if nothing is deleted, use faster code
        if ( dellen == 0 )
        {
            s = str;
            for ( std::string::size_type i = 0; i < len; ++i )
            {
                s[i] = table[ s[i] ];
            }
            return s;
        }


        int trans_table[256];
        for ( int i = 0; i < 256; i++)
        {
            trans_table[i] = table[i];
        }

        for ( std::string::size_type i = 0; i < dellen; i++)
        {
            trans_table[(int) deletechars[i] ] = -1;
        }

        for ( std::string::size_type i = 0; i < len; ++i )
        {
            if ( trans_table[ (int) str[i] ] != -1 )
            {
                s += table[ str[i] ];
            }
        }

        return s;

    }